

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O2

Vec_Int_t * Pla_ManComputeDistance1(Pla_Man_t *p)

{
  abctime aVar1;
  Vec_Int_t *pVVar2;
  abctime aVar3;
  abctime time;
  char *pStr;
  
  aVar1 = Abc_Clock();
  pVVar2 = Pla_ManComputeDistance1Int(p);
  pStr = (char *)((long)pVVar2->nSize / 4 & 0xffffffff);
  printf("Found %d pairs among %d cubes using cube hashing.  ",pStr,(ulong)(uint)(p->vCubes).nSize);
  aVar3 = Abc_Clock();
  Abc_PrintTime((int)aVar3 - (int)aVar1,pStr,time);
  return pVVar2;
}

Assistant:

Vec_Int_t * Pla_ManComputeDistance1( Pla_Man_t * p )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vPairs = Pla_ManComputeDistance1Int( p );
    printf( "Found %d pairs among %d cubes using cube hashing.  ", Vec_IntSize(vPairs)/4, Pla_ManCubeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vPairs;
}